

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_eng.c
# Opt level: O2

int gost_engine_destroy(ENGINE *e)

{
  EVP_PKEY_ASN1_METHOD **ppEVar1;
  gost_meth_minfo *pgVar2;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    GOST_deinit_digest(gost_digest_array[lVar3]);
  }
  for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 1) {
    GOST_deinit_cipher(gost_cipher_array[lVar3]);
  }
  gost_param_free();
  for (pgVar2 = gost_meth_array; pgVar2->nid != 0; pgVar2 = pgVar2 + 1) {
    ppEVar1 = pgVar2->ameth;
    *pgVar2->pmeth = (EVP_PKEY_METHOD *)0x0;
    *ppEVar1 = (EVP_PKEY_ASN1_METHOD *)0x0;
  }
  free_cached_groups();
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 8) {
    ASN1_OBJECT_free(*(ASN1_OBJECT **)(*(long *)((long)missing_NIDs + lVar3) + 0x18));
  }
  return 1;
}

Assistant:

static int gost_engine_destroy(ENGINE* e) {
    int i;

    for (i = 0; i < OSSL_NELEM(gost_digest_array); i++)
        GOST_deinit_digest(gost_digest_array[i]);
    for (i = 0; i < OSSL_NELEM(gost_cipher_array); i++)
        GOST_deinit_cipher(gost_cipher_array[i]);

    gost_param_free();

    struct gost_meth_minfo *minfo = gost_meth_array;
    for (; minfo->nid; minfo++) {
        *minfo->pmeth = NULL;
        *minfo->ameth = NULL;
    }

    free_cached_groups();
    free_NIDs();

# ifndef BUILDING_GOST_PROVIDER
    ERR_unload_GOST_strings();
# endif

    return 1;
}